

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

int irr::CIrrDeviceSDL::findCharToPassToIrrlicht(int assumedChar,EKEY_CODE key)

{
  EKEY_CODE key_local;
  int assumedChar_local;
  EKEY_CODE local_4;
  
  local_4 = key;
  if ((key != KEY_RETURN) && (key != KEY_ESCAPE)) {
    if ((assumedChar & 0x40000000U) == 0) {
      if ((key - KEY_PRIOR < 8) || (local_4 = assumedChar, key == KEY_NUMLOCK)) {
        local_4 = KEY_UNKNOWN;
      }
    }
    else {
      local_4 = KEY_UNKNOWN;
    }
  }
  return local_4;
}

Assistant:

int CIrrDeviceSDL::findCharToPassToIrrlicht(int assumedChar, EKEY_CODE key)
{
	// special cases that always return a char regardless of how the SDL keycode
	// looks
	switch (key) {
	case KEY_RETURN:
	case KEY_ESCAPE:
		return (int)key;
	default:
		break;
	}

	// SDL in-place ORs values with no character representation with 1<<30
	// https://wiki.libsdl.org/SDL2/SDLKeycodeLookup
	if (assumedChar & (1 << 30))
		return 0;

	switch (key) {
	case KEY_PRIOR:
	case KEY_NEXT:
	case KEY_HOME:
	case KEY_END:
	case KEY_LEFT:
	case KEY_UP:
	case KEY_RIGHT:
	case KEY_DOWN:
	case KEY_NUMLOCK:
		return 0;
	default:
		return assumedChar;
	}
}